

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PianoWidget.cpp
# Opt level: O2

int __thiscall PianoWidget::getNoteFromMouse(PianoWidget *this,QPoint mousePos)

{
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  uint uVar4;
  undefined7 *puVar5;
  uint uVar6;
  int iVar7;
  
  uVar6 = mousePos.xp >> 0x1f;
  uVar1 = (ulong)uVar6 << 0x20 | (ulong)mousePos & 0xffffffff;
  uVar2 = (long)uVar1 / 0xc;
  iVar7 = (int)((long)((ulong)(uint)((int)uVar2 >> 0x1f) << 0x20 | uVar2 & 0xffffffff) % 7);
  if (mousePos.yp < 0x2a) {
    uVar4 = (uint)((long)uVar1 % 0xc);
    if ((int)uVar4 < 5) {
      if ((iVar7 != 0) && (iVar3 = iVar7, iVar7 != 3)) {
LAB_001716e5:
        iVar7 = *(int *)(PianoWidgetTU::BLACKKEY_LEFTOF + (long)iVar3 * 4);
        puVar5 = (undefined7 *)&PianoWidgetTU::BLACKKEY_TO_NOTE;
        goto LAB_001716d1;
      }
    }
    else if (7 < uVar4) {
      iVar3 = 0;
      if (iVar7 != 6) {
        iVar3 = iVar7 + 1;
      }
      if ((iVar3 != 3) && (iVar3 != 0)) goto LAB_001716e5;
    }
  }
  puVar5 = &PianoWidgetTU::WHITEKEY_TO_NOTE;
LAB_001716d1:
  return (uint)*(byte *)((long)puVar5 + (long)iVar7) +
         (int)((long)((ulong)uVar6 << 0x20 | (ulong)mousePos & 0xffffffff) / 0x54) * 0xc;
}

Assistant:

int PianoWidget::getNoteFromMouse(QPoint mousePos) {
    auto const x = mousePos.x();
    auto const y = mousePos.y();

    bool isBlack = false;
    int wkeyInOctave = x / TU::WKEY_WIDTH;
    int octave = wkeyInOctave / TU::N_WHITEKEYS;
    wkeyInOctave %= TU::N_WHITEKEYS;
    int bkeyInOctave = 0;

    if (y < TU::BKEY_HEIGHT) {
        // check if the mouse is over a black key
        bkeyInOctave = TU::BLACKKEY_LEFTOF[wkeyInOctave];
        int wkeyx = x % TU::WKEY_WIDTH;

        if (bkeyInOctave != TU::KEYINDEX_NULL && wkeyx <= TU::BKEY_WIDTH_HALF) {
            // mouse is over the black key to the left of the white key
            isBlack = true;
        } else {
            // now check the right
            
            // get the black key to the left of the next white key
            bkeyInOctave = TU::BLACKKEY_LEFTOF[wkeyInOctave == TU::N_WHITEKEYS - 1 ? 0 : wkeyInOctave + 1];
            
            if (bkeyInOctave != TU::KEYINDEX_NULL && wkeyx >= TU::WKEY_WIDTH - TU::BKEY_WIDTH_HALF) {
                isBlack = true;
            }
        }
    }

    int note = octave * 12;
    if (isBlack) {
        note += TU::BLACKKEY_TO_NOTE[bkeyInOctave];
    } else {
        note += TU::WHITEKEY_TO_NOTE[wkeyInOctave];
    }

    return note;
}